

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

bool __thiscall gimage::RAWImageIO::handlesFile(RAWImageIO *this,char *name,bool reading)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte in_DL;
  char *in_RSI;
  size_t pos;
  string s;
  string local_80 [32];
  long local_60;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = std::__cxx11::string::find((char)local_40,0x26);
  if (local_60 != -1) {
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_40);
    std::__cxx11::string::operator=(local_40,local_80);
    std::__cxx11::string::~string(local_80);
  }
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < 5) {
    local_1 = 0;
  }
  else {
    lVar2 = std::__cxx11::string::find((char *)local_40,0x1723bc);
    lVar3 = std::__cxx11::string::size();
    if (lVar2 != lVar3 + -4) {
      lVar2 = std::__cxx11::string::find((char *)local_40,0x1723c1);
      lVar3 = std::__cxx11::string::size();
      if (lVar2 != lVar3 + -4) {
        local_1 = 0;
        goto LAB_0014212c;
      }
    }
    local_1 = 1;
  }
LAB_0014212c:
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool RAWImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;
  size_t pos;

  pos=s.find('&');

  if (pos != s.npos)
  {
    s=s.substr(0, pos);
  }

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.find(".raw") == s.size()-4 || s.find(".RAW") == s.size()-4)
  {
    return true;
  }

  return false;
}